

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcUtil.c
# Opt level: O3

int Abc_NtkLogicMakeSimpleCos(Abc_Ntk_t *pNtk,int fDuplicate)

{
  undefined1 *puVar1;
  long *plVar2;
  long lVar3;
  Abc_Ntk_t *pAVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  int iVar12;
  Abc_Obj_t *pAVar13;
  uint *puVar14;
  void *pvVar15;
  int *piVar16;
  uint *__ptr;
  Abc_Obj_t *pAVar17;
  void *pvVar18;
  Vec_Ptr_t *pVVar19;
  char *pcVar20;
  char *__s2;
  Abc_Obj_t *pAVar21;
  int extraout_EDX;
  int Fill;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  ulong extraout_RDX_01;
  ulong extraout_RDX_02;
  ulong extraout_RDX_03;
  ulong extraout_RDX_04;
  ulong extraout_RDX_05;
  ulong extraout_RDX_06;
  ulong extraout_RDX_07;
  ulong uVar22;
  long lVar23;
  ulong uVar24;
  ulong uVar25;
  uint uVar26;
  long lVar27;
  ulong local_78;
  int local_64;
  ulong local_60;
  int local_44;
  
  if (pNtk->ntkType != ABC_NTK_LOGIC) {
    __assert_fail("Abc_NtkIsLogic(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcUtil.c"
                  ,0x43d,"int Abc_NtkLogicMakeSimpleCos(Abc_Ntk_t *, int)");
  }
  uVar8 = Abc_NtkLevel(pNtk);
  pVVar19 = pNtk->vCos;
  if (0 < pVVar19->nSize) {
    lVar27 = 0;
    do {
      pAVar21 = (Abc_Obj_t *)pVVar19->pArray[lVar27];
      pAVar17 = (Abc_Obj_t *)pAVar21->pNtk->vObjs->pArray[*(pAVar21->vFanins).pArray];
      iVar9 = Abc_NodeIsConst(pAVar17);
      if (iVar9 != 0) {
        uVar26 = *(uint *)&pAVar21->field_0x14;
        uVar10 = Abc_NodeIsConst0(pAVar17);
        if ((uVar26 >> 10 & 1) == uVar10) {
          pAVar13 = Abc_NtkCreateNodeConst1(pNtk);
        }
        else {
          pAVar13 = Abc_NtkCreateNodeConst0(pNtk);
        }
        if ((*(uint *)&pAVar21->field_0x14 >> 10 & 1) != 0) {
          *(uint *)&pAVar21->field_0x14 = *(uint *)&pAVar21->field_0x14 & 0xfffffbff;
        }
        Abc_ObjPatchFanin(pAVar21,pAVar17,pAVar13);
        if ((pAVar17->vFanouts).nSize == 0) {
          Abc_NtkDeleteObj(pAVar17);
        }
      }
      lVar27 = lVar27 + 1;
      pVVar19 = pNtk->vCos;
    } while (lVar27 < pVVar19->nSize);
  }
  puVar14 = (uint *)malloc(0x10);
  puVar14[0] = 100;
  puVar14[1] = 0;
  pvVar15 = malloc(800);
  *(void **)(puVar14 + 2) = pvVar15;
  uVar22 = extraout_RDX;
  if ((pNtk->vTravIds).pArray == (int *)0x0) {
    iVar9 = pNtk->vObjs->nSize;
    uVar25 = (long)iVar9 + 500;
    iVar12 = (int)uVar25;
    if ((pNtk->vTravIds).nCap < iVar12) {
      piVar16 = (int *)malloc(uVar25 * 4);
      (pNtk->vTravIds).pArray = piVar16;
      if (piVar16 == (int *)0x0) goto LAB_00889e63;
      (pNtk->vTravIds).nCap = iVar12;
      uVar22 = extraout_RDX_00;
    }
    else {
      piVar16 = (int *)0x0;
    }
    if (-500 < iVar9) {
      memset(piVar16,0,(uVar25 & 0xffffffff) << 2);
      uVar22 = extraout_RDX_01;
    }
    (pNtk->vTravIds).nSize = iVar12;
  }
  iVar9 = pNtk->nTravIds;
  pNtk->nTravIds = iVar9 + 1;
  if (0x3ffffffe < iVar9) goto LAB_00889e06;
  if (pVVar19->nSize < 1) {
LAB_008897d8:
    local_64 = 0;
  }
  else {
    uVar26 = 0;
    local_78 = 100;
    lVar27 = 0;
    do {
      plVar2 = (long *)pVVar19->pArray[lVar27];
      if ((*(byte *)((long)plVar2 + 0x15) & 4) != 0) {
        plVar2 = *(long **)(*(long *)(*(long *)(*plVar2 + 0x20) + 8) + (long)*(int *)plVar2[4] * 8);
        lVar23 = *plVar2;
        iVar9 = (int)plVar2[2];
        Vec_IntFillExtra((Vec_Int_t *)(lVar23 + 0xe0),iVar9 + 1,(int)uVar22);
        if (((long)iVar9 < 0) || (*(int *)(lVar23 + 0xe4) <= iVar9)) goto LAB_00889d2d;
        lVar3 = *plVar2;
        iVar12 = *(int *)(lVar3 + 0xd8);
        uVar22 = extraout_RDX_02;
        if (*(int *)(*(long *)(lVar23 + 0xe8) + (long)iVar9 * 4) != iVar12) {
          iVar9 = (int)plVar2[2];
          Vec_IntFillExtra((Vec_Int_t *)(lVar3 + 0xe0),iVar9 + 1,(int)extraout_RDX_02);
          if (((long)iVar9 < 0) || (*(int *)(lVar3 + 0xe4) <= iVar9)) goto LAB_00889d8a;
          *(int *)(*(long *)(lVar3 + 0xe8) + (long)iVar9 * 4) = iVar12;
          uVar10 = (uint)local_78;
          if (uVar26 == uVar10) {
            if ((int)uVar10 < 0x10) {
              if (*(void **)(puVar14 + 2) == (void *)0x0) {
                pvVar15 = malloc(0x80);
              }
              else {
                pvVar15 = realloc(*(void **)(puVar14 + 2),0x80);
              }
              *(void **)(puVar14 + 2) = pvVar15;
              *puVar14 = 0x10;
              local_78 = 0x10;
            }
            else {
              local_78 = (ulong)(uVar10 * 2);
              if (*(void **)(puVar14 + 2) == (void *)0x0) {
                pvVar15 = malloc(local_78 * 8);
              }
              else {
                pvVar15 = realloc(*(void **)(puVar14 + 2),local_78 * 8);
              }
              *(void **)(puVar14 + 2) = pvVar15;
              *puVar14 = uVar10 * 2;
            }
          }
          else {
            pvVar15 = *(void **)(puVar14 + 2);
          }
          lVar23 = (long)(int)uVar26;
          uVar26 = uVar26 + 1;
          uVar22 = (ulong)uVar26;
          puVar14[1] = uVar26;
          *(long **)((long)pvVar15 + lVar23 * 8) = plVar2;
        }
      }
      lVar27 = lVar27 + 1;
      pVVar19 = pNtk->vCos;
    } while (lVar27 < pVVar19->nSize);
    if ((int)uVar26 < 1) goto LAB_008897d8;
    __ptr = (uint *)malloc(0x10);
    __ptr[0] = 100;
    __ptr[1] = 0;
    pvVar15 = malloc(800);
    *(void **)(__ptr + 2) = pvVar15;
    uVar25 = 0;
    uVar22 = 100;
    local_64 = 0;
    local_44 = 0;
    do {
      pAVar21 = *(Abc_Obj_t **)(*(long *)(puVar14 + 2) + uVar25 * 8);
      lVar27 = (long)(pAVar21->vFanouts).nSize;
      if (lVar27 < 1) {
LAB_00889d4c:
        __assert_fail("fHasInv",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcUtil.c"
                      ,0x471,"int Abc_NtkLogicMakeSimpleCos(Abc_Ntk_t *, int)");
      }
      lVar23 = 0;
      bVar6 = false;
      bVar7 = false;
      bVar5 = false;
      do {
        uVar10 = *(uint *)((long)pAVar21->pNtk->vObjs->pArray[(pAVar21->vFanouts).pArray[lVar23]] +
                          0x14);
        if ((uVar10 & 0xf) - 5 < 0xfffffffe) {
          bVar7 = true;
          if ((uVar10 >> 10 & 1) != 0) {
            __assert_fail("!Abc_ObjFaninC0(pNode)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcUtil.c"
                          ,0x468,"int Abc_NtkLogicMakeSimpleCos(Abc_Ntk_t *, int)");
          }
        }
        else if ((uVar10 >> 10 & 1) == 0) {
          bVar6 = true;
        }
        else {
          bVar5 = true;
        }
        lVar23 = lVar23 + 1;
      } while (lVar27 != lVar23);
      if (!bVar5) goto LAB_00889d4c;
      uVar10 = *(uint *)&pAVar21->field_0x14 & 0xf;
      if ((((bVar6) || (uVar10 == 2)) || (uVar10 == 5)) ||
         ((bVar7 && (pNtk->ntkFunc == ABC_FUNC_MAP)))) {
        if ((fDuplicate == 0) || (*(uint *)&pAVar21->field_0x14 >> 0xc != uVar8 || uVar10 != 7)) {
          pAVar17 = Abc_NtkCreateNodeInv(pNtk,pAVar21);
          local_64 = local_64 + 1;
        }
        else {
          pAVar17 = Abc_NtkDupObj(pNtk,pAVar21,0);
          if (0 < (pAVar21->vFanins).nSize) {
            lVar27 = 0;
            do {
              Abc_ObjAddFanin(pAVar17,(Abc_Obj_t *)
                                      pAVar21->pNtk->vObjs->pArray
                                      [(pAVar21->vFanins).pArray[lVar27]]);
              lVar27 = lVar27 + 1;
            } while (lVar27 < (pAVar21->vFanins).nSize);
          }
          Abc_NodeComplement(pAVar17);
          local_44 = local_44 + 1;
        }
        __ptr[1] = 0;
        iVar9 = (pAVar21->vFanouts).nSize;
        if (iVar9 < 1) {
LAB_00889d6b:
          __assert_fail("Vec_PtrSize(vFanouts) > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcUtil.c"
                        ,0x487,"int Abc_NtkLogicMakeSimpleCos(Abc_Ntk_t *, int)");
        }
        uVar10 = 0;
        lVar27 = 0;
        do {
          pvVar15 = pAVar21->pNtk->vObjs->pArray[(pAVar21->vFanouts).pArray[lVar27]];
          uVar11 = *(uint *)((long)pvVar15 + 0x14);
          if (((uVar11 >> 10 & 1) != 0) && (0xfffffffd < (uVar11 & 0xf) - 5)) {
            uVar11 = (uint)uVar22;
            if (uVar10 == uVar11) {
              if ((int)uVar11 < 0x10) {
                if (*(void **)(__ptr + 2) == (void *)0x0) {
                  pvVar18 = malloc(0x80);
                }
                else {
                  pvVar18 = realloc(*(void **)(__ptr + 2),0x80);
                }
                *(void **)(__ptr + 2) = pvVar18;
                *__ptr = 0x10;
                uVar22 = 0x10;
              }
              else {
                uVar22 = (ulong)(uVar11 * 2);
                if (*(void **)(__ptr + 2) == (void *)0x0) {
                  pvVar18 = malloc(uVar22 * 8);
                }
                else {
                  pvVar18 = realloc(*(void **)(__ptr + 2),uVar22 * 8);
                }
                *(void **)(__ptr + 2) = pvVar18;
                *__ptr = uVar11 * 2;
              }
            }
            else {
              pvVar18 = *(void **)(__ptr + 2);
            }
            lVar23 = (long)(int)uVar10;
            uVar10 = uVar10 + 1;
            __ptr[1] = uVar10;
            *(void **)((long)pvVar18 + lVar23 * 8) = pvVar15;
            iVar9 = (pAVar21->vFanouts).nSize;
          }
          lVar27 = lVar27 + 1;
        } while (lVar27 < iVar9);
        if ((int)uVar10 < 1) goto LAB_00889d6b;
        pvVar15 = *(void **)(__ptr + 2);
        uVar24 = 0;
        do {
          pAVar13 = *(Abc_Obj_t **)((long)pvVar15 + uVar24 * 8);
          puVar1 = &pAVar13->field_0x14;
          *(uint *)puVar1 = *(uint *)puVar1 ^ 0x400;
          Abc_ObjPatchFanin(pAVar13,pAVar21,pAVar17);
          uVar11 = *(uint *)&pAVar21->field_0x14 & 0xf;
          if (((uVar11 != 2) && (uVar11 != 5)) && ((pAVar21->vFanouts).nSize < 1)) {
            __assert_fail("Abc_ObjIsCi(pDriver) || Abc_ObjFanoutNum(pDriver) > 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcUtil.c"
                          ,0x48c,"int Abc_NtkLogicMakeSimpleCos(Abc_Ntk_t *, int)");
          }
          uVar24 = uVar24 + 1;
        } while (uVar10 != uVar24);
      }
      else {
        if (uVar10 != 7) {
          __assert_fail("Abc_ObjIsNode(pDriver)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcUtil.c"
                        ,0x492,"int Abc_NtkLogicMakeSimpleCos(Abc_Ntk_t *, int)");
        }
        Abc_NodeComplement(pAVar21);
        if (0 < (pAVar21->vFanouts).nSize) {
          lVar27 = 0;
          do {
            pAVar17 = (Abc_Obj_t *)pAVar21->pNtk->vObjs->pArray[(pAVar21->vFanouts).pArray[lVar27]];
            uVar10 = *(uint *)&pAVar17->field_0x14;
            if ((uVar10 & 0xf) - 5 < 0xfffffffe) {
              if ((uVar10 & 0xf) != 7) {
                __assert_fail("0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcUtil.c"
                              ,0x49d,"int Abc_NtkLogicMakeSimpleCos(Abc_Ntk_t *, int)");
              }
              Abc_NodeComplementInput(pAVar17,pAVar21);
            }
            else {
              if ((uVar10 >> 10 & 1) == 0) {
                __assert_fail("Abc_ObjFaninC0(pNode)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcUtil.c"
                              ,0x498,"int Abc_NtkLogicMakeSimpleCos(Abc_Ntk_t *, int)");
              }
              *(uint *)&pAVar17->field_0x14 = uVar10 & 0xfffffbff;
            }
            lVar27 = lVar27 + 1;
          } while (lVar27 < (pAVar21->vFanouts).nSize);
        }
      }
      uVar25 = uVar25 + 1;
    } while (uVar25 != uVar26);
    if (pvVar15 != (void *)0x0) {
      free(pvVar15);
    }
    free(__ptr);
    local_64 = local_64 + local_44;
  }
  if (*(void **)(puVar14 + 2) != (void *)0x0) {
    free(*(void **)(puVar14 + 2));
  }
  free(puVar14);
  puVar14 = (uint *)malloc(0x10);
  puVar14[1] = 0;
  pvVar15 = malloc(800);
  *(void **)(puVar14 + 2) = pvVar15;
  uVar22 = extraout_RDX_03;
  if ((pNtk->vTravIds).pArray == (int *)0x0) {
    iVar9 = pNtk->vObjs->nSize;
    uVar25 = (long)iVar9 + 500;
    iVar12 = (int)uVar25;
    if ((pNtk->vTravIds).nCap < iVar12) {
      piVar16 = (int *)malloc(uVar25 * 4);
      (pNtk->vTravIds).pArray = piVar16;
      if (piVar16 == (int *)0x0) {
LAB_00889e63:
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      (pNtk->vTravIds).nCap = iVar12;
      uVar22 = extraout_RDX_04;
    }
    else {
      piVar16 = (int *)0x0;
    }
    if (-500 < iVar9) {
      memset(piVar16,0,(uVar25 & 0xffffffff) << 2);
      uVar22 = extraout_RDX_05;
    }
    (pNtk->vTravIds).nSize = iVar12;
  }
  iVar9 = pNtk->nTravIds;
  pNtk->nTravIds = iVar9 + 1;
  if (iVar9 < 0x3fffffff) {
    pVVar19 = pNtk->vCos;
    if (0 < pVVar19->nSize) {
      uVar26 = 0;
      local_60 = 100;
      local_78 = 100;
      lVar27 = 0;
      do {
        iVar9 = (int)uVar22;
        pAVar21 = (Abc_Obj_t *)pVVar19->pArray[lVar27];
        pAVar17 = (Abc_Obj_t *)pAVar21->pNtk->vObjs->pArray[*(pAVar21->vFanins).pArray];
        uVar10 = *(uint *)&pAVar17->field_0x14 & 0xf;
        if ((uVar10 == 5) || (uVar10 == 2)) {
          pcVar20 = Abc_ObjName(pAVar17);
          __s2 = Abc_ObjName(pAVar21);
          iVar12 = strcmp(pcVar20,__s2);
          iVar9 = extraout_EDX;
          if (iVar12 == 0) goto LAB_00889978;
          uVar10 = (uint)local_78;
          if (uVar26 == uVar10) {
            if ((int)uVar10 < 0x10) {
              if (*(void **)(puVar14 + 2) == (void *)0x0) {
                pvVar15 = malloc(0x80);
              }
              else {
                pvVar15 = realloc(*(void **)(puVar14 + 2),0x80);
              }
              *(void **)(puVar14 + 2) = pvVar15;
              *puVar14 = 0x10;
              local_60 = 0x10;
              local_78 = 0x10;
            }
            else {
              local_78 = (ulong)(uVar10 * 2);
              if (*(void **)(puVar14 + 2) == (void *)0x0) {
                pvVar15 = malloc(local_78 * 8);
              }
              else {
                pvVar15 = realloc(*(void **)(puVar14 + 2),local_78 * 8);
              }
              *(void **)(puVar14 + 2) = pvVar15;
              *puVar14 = uVar10 * 2;
              local_60 = local_78;
            }
          }
          else {
            pvVar15 = *(void **)(puVar14 + 2);
          }
          puVar14[1] = uVar26 + 1;
          *(Abc_Obj_t **)((long)pvVar15 + (long)(int)uVar26 * 8) = pAVar21;
LAB_00889b61:
          uVar26 = uVar26 + 1;
          uVar22 = (ulong)uVar26;
        }
        else {
LAB_00889978:
          pAVar4 = pAVar17->pNtk;
          iVar12 = pAVar17->Id;
          Vec_IntFillExtra(&pAVar4->vTravIds,iVar12 + 1,iVar9);
          if (((long)iVar12 < 0) || ((pAVar4->vTravIds).nSize <= iVar12)) {
LAB_00889d2d:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                          ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          if ((pAVar4->vTravIds).pArray[iVar12] == pAVar17->pNtk->nTravIds) {
            pAVar17 = pAVar17->pNext;
            pcVar20 = Abc_ObjName(pAVar21);
            iVar9 = strcmp((char *)pAVar17,pcVar20);
            uVar22 = extraout_RDX_06;
            if (iVar9 != 0) {
              uVar10 = (uint)local_60;
              if (uVar26 == uVar10) {
                if ((int)uVar10 < 0x10) {
                  if (*(void **)(puVar14 + 2) == (void *)0x0) {
                    pvVar15 = malloc(0x80);
                  }
                  else {
                    pvVar15 = realloc(*(void **)(puVar14 + 2),0x80);
                  }
                  *(void **)(puVar14 + 2) = pvVar15;
                  *puVar14 = 0x10;
                  local_60 = 0x10;
                }
                else {
                  local_60 = (ulong)(uVar10 * 2);
                  if (*(void **)(puVar14 + 2) == (void *)0x0) {
                    pvVar15 = malloc(local_60 * 8);
                  }
                  else {
                    pvVar15 = realloc(*(void **)(puVar14 + 2),local_60 * 8);
                  }
                  *(void **)(puVar14 + 2) = pvVar15;
                  *puVar14 = uVar10 * 2;
                }
              }
              else {
                pvVar15 = *(void **)(puVar14 + 2);
              }
              puVar14[1] = uVar26 + 1;
              *(Abc_Obj_t **)((long)pvVar15 + (long)(int)uVar26 * 8) = pAVar21;
              local_78 = local_60;
              goto LAB_00889b61;
            }
          }
          else {
            pAVar21 = (Abc_Obj_t *)Abc_ObjName(pAVar21);
            pAVar17->pNext = pAVar21;
            pAVar4 = pAVar17->pNtk;
            iVar9 = pAVar17->Id;
            iVar12 = pAVar4->nTravIds;
            Vec_IntFillExtra(&pAVar4->vTravIds,iVar9 + 1,Fill);
            if (((long)iVar9 < 0) || ((pAVar4->vTravIds).nSize <= iVar9)) {
LAB_00889d8a:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                            ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
            }
            (pAVar4->vTravIds).pArray[iVar9] = iVar12;
            uVar22 = extraout_RDX_07;
          }
        }
        lVar27 = lVar27 + 1;
        pVVar19 = pNtk->vCos;
      } while (lVar27 < pVVar19->nSize);
      pvVar15 = *(void **)(puVar14 + 2);
      if (0 < (int)uVar26) {
        uVar22 = 0;
        iVar9 = 0;
        iVar12 = 0;
        do {
          pAVar21 = *(Abc_Obj_t **)((long)pvVar15 + uVar22 * 8);
          pAVar17 = (Abc_Obj_t *)pAVar21->pNtk->vObjs->pArray[*(pAVar21->vFanins).pArray];
          if (((fDuplicate == 0) || ((*(uint *)&pAVar17->field_0x14 & 0xf) != 7)) ||
             ((pNtk->ntkFunc != ABC_FUNC_MAP && (*(uint *)&pAVar17->field_0x14 >> 0xc != uVar8)))) {
            pAVar13 = Abc_NtkCreateNodeBuf(pNtk,pAVar17);
            pcVar20 = Abc_ObjName(pAVar17);
            Abc_ObjAssignName(pAVar13,pcVar20,"_buf");
            iVar12 = iVar12 + 1;
          }
          else {
            pAVar13 = Abc_NtkDupObj(pNtk,pAVar17,0);
            if (0 < (pAVar17->vFanins).nSize) {
              lVar27 = 0;
              do {
                Abc_ObjAddFanin(pAVar13,(Abc_Obj_t *)
                                        pAVar17->pNtk->vObjs->pArray
                                        [(pAVar17->vFanins).pArray[lVar27]]);
                lVar27 = lVar27 + 1;
              } while (lVar27 < (pAVar17->vFanins).nSize);
            }
            iVar9 = iVar9 + 1;
          }
          Abc_ObjPatchFanin(pAVar21,pAVar17,pAVar13);
          uVar10 = *(uint *)&pAVar17->field_0x14 & 0xf;
          if (((uVar10 != 2) && (uVar10 != 5)) && ((pAVar17->vFanouts).nSize < 1)) {
            __assert_fail("Abc_ObjIsCi(pDriver) || Abc_ObjFanoutNum(pDriver) > 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcUtil.c"
                          ,0x4e0,"int Abc_NtkLogicMakeSimpleCos(Abc_Ntk_t *, int)");
          }
          uVar22 = uVar22 + 1;
        } while (uVar22 != uVar26);
        local_64 = iVar12 + local_64 + iVar9;
      }
    }
    if (pvVar15 != (void *)0x0) {
      free(pvVar15);
    }
    free(puVar14);
    return local_64;
  }
LAB_00889e06:
  __assert_fail("p->nTravIds < (1<<30)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abc.h"
                ,0x198,"void Abc_NtkIncrementTravId(Abc_Ntk_t *)");
}

Assistant:

int Abc_NtkLogicMakeSimpleCos( Abc_Ntk_t * pNtk, int fDuplicate )
{
    int fAddBuffers = 1;
    Vec_Ptr_t * vDrivers, * vCoTerms;
    Abc_Obj_t * pNode, * pDriver, * pDriverNew, * pFanin;
    int i, k, LevelMax, nTotal = 0;
    assert( Abc_NtkIsLogic(pNtk) );
    LevelMax = Abc_NtkLevel(pNtk);
//    Abc_NtkLogicMakeSimpleCosTest( pNtk, fDuplicate );

    // fix constant drivers
    Abc_NtkForEachCo( pNtk, pNode, i ) 
    {
        pDriver = Abc_ObjFanin0(pNode);
        if ( !Abc_NodeIsConst(pDriver) )
            continue;
        pDriverNew = (Abc_ObjFaninC0(pNode) == Abc_NodeIsConst0(pDriver)) ? Abc_NtkCreateNodeConst1(pNtk) : Abc_NtkCreateNodeConst0(pNtk);
        if ( Abc_ObjFaninC0(pNode) )
            Abc_ObjXorFaninC( pNode, 0 );
        Abc_ObjPatchFanin( pNode, pDriver, pDriverNew );
        if ( Abc_ObjFanoutNum(pDriver) == 0 )
            Abc_NtkDeleteObj( pDriver );
    }

    // collect drivers pointed by complemented edges
    vDrivers = Vec_PtrAlloc( 100 );
    Abc_NtkIncrementTravId( pNtk );
    Abc_NtkForEachCo( pNtk, pNode, i ) 
    {
        if ( !Abc_ObjFaninC0(pNode) )
            continue;
        pDriver = Abc_ObjFanin0(pNode);
        if ( Abc_NodeIsTravIdCurrent(pDriver) )
            continue;
        Abc_NodeSetTravIdCurrent(pDriver);
        Vec_PtrPush( vDrivers, pDriver );
    }
    // fix complemented drivers
    if ( Vec_PtrSize(vDrivers) > 0 )
    {
        int nDupGates = 0, nDupInvs = 0, nDupChange = 0;
        Vec_Ptr_t * vFanouts = Vec_PtrAlloc( 100 );
        Vec_PtrForEachEntry( Abc_Obj_t *, vDrivers, pDriver, i )
        {
            int fHasDir = 0, fHasInv = 0, fHasOther = 0;
            Abc_ObjForEachFanout( pDriver, pNode, k )
            {
                if ( !Abc_ObjIsCo(pNode) )
                {
                    assert( !Abc_ObjFaninC0(pNode) );
                    fHasOther = 1;
                    continue;
                }
                if ( Abc_ObjFaninC0(pNode) )
                    fHasInv = 1;
                else //if ( Abc_ObjFaninC0(pNode) )
                    fHasDir = 1;
            }
            assert( fHasInv );
            if ( Abc_ObjIsCi(pDriver) || fHasDir || (fHasOther && Abc_NtkHasMapping(pNtk)) ) // cannot change
            {
                // duplicate if critical
                if ( fDuplicate && Abc_ObjIsNode(pDriver) && Abc_ObjLevel(pDriver) == LevelMax )
                {
                    pDriverNew = Abc_NtkDupObj( pNtk, pDriver, 0 ); 
                    Abc_ObjForEachFanin( pDriver, pFanin, k )
                        Abc_ObjAddFanin( pDriverNew, pFanin );
                    Abc_NodeComplement( pDriverNew );
                    nDupGates++;
                }
                else // add inverter
                {
                    pDriverNew = Abc_NtkCreateNodeInv( pNtk, pDriver );
                    nDupInvs++;
                }
                // collect CO fanouts to be redirected to the new node
                Vec_PtrClear( vFanouts );
                Abc_ObjForEachFanout( pDriver, pNode, k )
                    if ( Abc_ObjIsCo(pNode) && Abc_ObjFaninC0(pNode) )
                        Vec_PtrPush( vFanouts, pNode );
                assert( Vec_PtrSize(vFanouts) > 0 );
                Vec_PtrForEachEntry( Abc_Obj_t *, vFanouts, pNode, k )
                {
                    Abc_ObjXorFaninC( pNode, 0 );
                    Abc_ObjPatchFanin( pNode, pDriver, pDriverNew );
                    assert( Abc_ObjIsCi(pDriver) || Abc_ObjFanoutNum(pDriver) > 0 );
                }
            }
            else // can change
            {
                // change polarity of the driver
                assert( Abc_ObjIsNode(pDriver) );
                Abc_NodeComplement( pDriver );
                Abc_ObjForEachFanout( pDriver, pNode, k )
                {
                    if ( Abc_ObjIsCo(pNode) )
                    {
                        assert( Abc_ObjFaninC0(pNode) );
                        Abc_ObjXorFaninC( pNode, 0 );
                    }
                    else if ( Abc_ObjIsNode(pNode) )
                        Abc_NodeComplementInput( pNode, pDriver );
                    else assert( 0 );
                }
                nDupChange++;
            }
        }
        Vec_PtrFree( vFanouts );
//        printf( "Resolving inverted CO drivers: Invs = %d. Dups = %d. Changes = %d.\n",
//            nDupInvs, nDupGates, nDupChange );
        nTotal += nDupInvs + nDupGates;
    }
    Vec_PtrFree( vDrivers );

    // collect COs that needs fixing by adding buffers or duplicating
    vCoTerms = Vec_PtrAlloc( 100 );
    Abc_NtkIncrementTravId( pNtk );
    
    // The following cases should be addressed only if the network is written 
    // into a BLIF file. Otherwise, it is possible to skip them:
    // (1) if a CO points to a CI with a different name
    // (2) if an internal node drives more than one CO
    if ( fAddBuffers )
    Abc_NtkForEachCo( pNtk, pNode, i )
    {
        // if the driver is a CI and has different name, this is an error
        pDriver = Abc_ObjFanin0(pNode);
        if ( Abc_ObjIsCi(pDriver) && strcmp(Abc_ObjName(pDriver), Abc_ObjName(pNode)) )
        {
            Vec_PtrPush( vCoTerms, pNode );
            continue;
        }
        // if the driver is visited for the first time, remember the CO name
        if ( !Abc_NodeIsTravIdCurrent(pDriver) )
        {
            pDriver->pNext = (Abc_Obj_t *)Abc_ObjName(pNode);
            Abc_NodeSetTravIdCurrent(pDriver);
            continue;
        }
        // the driver has second CO - if they have different name, this is an error
        if ( strcmp((char *)pDriver->pNext, Abc_ObjName(pNode)) ) // diff names
        {
            Vec_PtrPush( vCoTerms, pNode );
            continue;
        }
    }
    // fix duplication problem
    if ( Vec_PtrSize(vCoTerms) > 0 )
    {
        int nDupBufs = 0, nDupGates = 0;
        Vec_PtrForEachEntry( Abc_Obj_t *, vCoTerms, pNode, i )
        {
            pDriver = Abc_ObjFanin0(pNode);
            // duplicate if critical
            if ( fDuplicate && Abc_ObjIsNode(pDriver) && (Abc_NtkHasMapping(pNtk) || Abc_ObjLevel(pDriver) == LevelMax) )
            {
                pDriverNew = Abc_NtkDupObj( pNtk, pDriver, 0 ); 
                Abc_ObjForEachFanin( pDriver, pFanin, k )
                    Abc_ObjAddFanin( pDriverNew, pFanin );
                nDupGates++;
            }
            else // add buffer
            {
                pDriverNew = Abc_NtkCreateNodeBuf( pNtk, pDriver );
                Abc_ObjAssignName( pDriverNew, Abc_ObjName(pDriver), "_buf" );
                nDupBufs++;
            }
            // swing the PO
            Abc_ObjPatchFanin( pNode, pDriver, pDriverNew );
            assert( Abc_ObjIsCi(pDriver) || Abc_ObjFanoutNum(pDriver) > 0 );
        }
//        printf( "Resolving shared CO drivers: Bufs = %d. Dups = %d.\n", nDupBufs, nDupGates );
        nTotal += nDupBufs + nDupGates;
    }
    Vec_PtrFree( vCoTerms );
    return nTotal;
}